

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::ParseColorChunk
          (Discreet3DSImporter *this,aiColor3D *out,bool acceptPercent)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  float fVar4;
  ai_real aVar5;
  Chunk chunk;
  undefined8 uStack_28;
  
  if (out == (aiColor3D *)0x0) {
    __assert_fail("out != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3DS/3DSLoader.cpp"
                  ,0x552,"void Assimp::Discreet3DSImporter::ParseColorChunk(aiColor3D *, bool)");
  }
  uStack_28 = in_RAX;
  if ((ParseColorChunk(aiColor3D*,bool)::clrError == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseColorChunk(aiColor3D*,bool)::clrError), iVar3 != 0)) {
    ParseColorChunk::clrError.r = NAN;
    ParseColorChunk::clrError.g = NAN;
    ParseColorChunk::clrError.b = NAN;
    __cxa_guard_release(&ParseColorChunk(aiColor3D*,bool)::clrError);
  }
  ReadChunk(this,(Chunk *)((long)&uStack_28 + 2));
  uVar2 = uStack_28._4_4_ - 6;
  if (uStack_28._2_2_ - 0x11 < 2) {
    if (2 < uVar2) {
      bVar1 = StreamReader<false,_false>::Get<signed_char>(this->stream);
      out->r = (float)bVar1 * 0.003921569;
      bVar1 = StreamReader<false,_false>::Get<signed_char>(this->stream);
      out->g = (float)bVar1 * 0.003921569;
      bVar1 = StreamReader<false,_false>::Get<signed_char>(this->stream);
      fVar4 = (float)bVar1 * 0.003921569;
      goto LAB_003ce877;
    }
  }
  else if (uStack_28._2_2_ == 0x10) {
LAB_003ce785:
    if (0xb < uVar2) {
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      out->r = fVar4;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      out->g = fVar4;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      goto LAB_003ce877;
    }
  }
  else if (uStack_28._2_2_ == 0x31) {
    if (acceptPercent && 3 < uVar2) {
      aVar5 = StreamReader<false,_false>::Get<float>(this->stream);
LAB_003ce853:
      out->r = aVar5;
      out->b = aVar5;
      out->g = aVar5;
      return;
    }
  }
  else {
    if (uStack_28._2_2_ != 0x30) {
      if (uStack_28._2_2_ != 0x13) {
        StreamReader<false,_false>::IncPtr(this->stream,(ulong)uVar2);
        ParseColorChunk(this,out,acceptPercent);
        return;
      }
      goto LAB_003ce785;
    }
    if (acceptPercent && uVar2 != 0) {
      bVar1 = StreamReader<false,_false>::Get<signed_char>(this->stream);
      aVar5 = (float)bVar1 / 255.0;
      goto LAB_003ce853;
    }
  }
  aVar5 = ParseColorChunk::clrError.g;
  out->r = ParseColorChunk::clrError.r;
  out->g = aVar5;
  fVar4 = ParseColorChunk::clrError.b;
LAB_003ce877:
  out->b = fVar4;
  return;
}

Assistant:

void Discreet3DSImporter::ParseColorChunk( aiColor3D* out, bool acceptPercent )
{
    ai_assert(out != NULL);

    // error return value
    const ai_real qnan = get_qnan();
    static const aiColor3D clrError = aiColor3D(qnan,qnan,qnan);

    Discreet3DS::Chunk chunk;
    ReadChunk(&chunk);
    const unsigned int diff = chunk.Size - sizeof(Discreet3DS::Chunk);

    bool bGamma = false;

    // Get the type of the chunk
    switch(chunk.Flag)
    {
    case Discreet3DS::CHUNK_LINRGBF:
        bGamma = true;

    case Discreet3DS::CHUNK_RGBF:
        if (sizeof(float) * 3 > diff)   {
            *out = clrError;
            return;
        }
        out->r = stream->GetF4();
        out->g = stream->GetF4();
        out->b = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_LINRGBB:
        bGamma = true;
    case Discreet3DS::CHUNK_RGBB:
        {
            if ( sizeof( char ) * 3 > diff ) {
                *out = clrError;
                return;
            }
            const ai_real invVal = ai_real( 1.0 ) / ai_real( 255.0 );
            out->r = ( ai_real ) ( uint8_t ) stream->GetI1() * invVal;
            out->g = ( ai_real ) ( uint8_t ) stream->GetI1() * invVal;
            out->b = ( ai_real ) ( uint8_t ) stream->GetI1() * invVal;
        }
        break;

    // Percentage chunks are accepted, too.
    case Discreet3DS::CHUNK_PERCENTF:
        if (acceptPercent && 4 <= diff) {
            out->g = out->b = out->r = stream->GetF4();
            break;
        }
        *out = clrError;
        return;

    case Discreet3DS::CHUNK_PERCENTW:
        if (acceptPercent && 1 <= diff) {
            out->g = out->b = out->r = (ai_real)(uint8_t)stream->GetI1() / ai_real( 255.0 );
            break;
        }
        *out = clrError;
        return;

    default:
        stream->IncPtr(diff);
        // Skip unknown chunks, hope this won't cause any problems.
        return ParseColorChunk(out,acceptPercent);
    };
    (void)bGamma;
}